

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O2

HRESULT __thiscall
Js::DebugContext::RundownSourcesAndReparse
          (DebugContext *this,bool shouldPerformSourceRundown,bool shouldReparseFunctions)

{
  JavascriptLibrary *this_00;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Utf8SourceInfo *pUVar2;
  SRCINFO *pSVar3;
  HostDebugContext *pHVar4;
  List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar5;
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar6;
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_> *pSVar7;
  FunctionInfo *this_01;
  ScriptContext *pSVar8;
  Type pcVar9;
  code *pcVar10;
  byte bVar11;
  bool bVar12;
  int iVar13;
  RegSlot RVar14;
  int iVar15;
  Data DVar16;
  TempArenaAllocatorObject *tempAllocator;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar17;
  undefined4 *puVar18;
  undefined4 extraout_var;
  SourceContextInfo *pSVar19;
  Type *pTVar20;
  ParseableFunctionInfo *pPVar21;
  FunctionBody *pFVar22;
  LPCWSTR title;
  undefined8 extraout_RAX;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *pLVar23;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *this_03;
  ulong uVar24;
  undefined7 in_register_00000011;
  HRESULT HVar25;
  undefined7 in_register_00000031;
  int i_1;
  int i;
  long lVar26;
  void *unaff_retaddr;
  undefined1 local_108 [8];
  EnterScriptObject __enterScriptObject;
  undefined1 auStack_d8 [8];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  charcount_t local_88;
  RegSlot local_84;
  List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
  *local_80;
  List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *local_78
  ;
  DWORD_PTR local_70;
  AutoNestedHandledExceptionType local_68;
  undefined4 local_64;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType_2;
  undefined4 uStack_5c;
  HRESULT local_38;
  
  local_64 = (undefined4)CONCAT71(in_register_00000031,shouldPerformSourceRundown);
  if ((int)CONCAT71(in_register_00000011,shouldReparseFunctions) != 0) {
    this->field_0x1c = this->field_0x1c | 2;
  }
  Output::Trace(DebuggerPhase,
                L"DebugContext::RundownSourcesAndReparse scriptContext 0x%p, shouldPerformSourceRundown %d, shouldReparseFunctions %d\n"
                ,this->scriptContext,(ulong)shouldPerformSourceRundown,(ulong)shouldReparseFunctions
               );
  this_00 = (JavascriptLibrary *)this->scriptContext->threadContext;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)auStack_d8,ExceptionType_OutOfMemory);
  tempAllocator = ThreadContext::GetTemporaryAllocator((ThreadContext *)this_00,L"debuggerAlloc");
  local_80 = JsUtil::
             List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
             ::New(this->scriptContext->recycler,4);
  this_02 = (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::ArenaAllocator>(0x38,&tempAllocator->allocator,0x35916e);
  JsUtil::
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_02,&tempAllocator->allocator,0);
  pLVar17 = Memory::
            RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
            ::operator->(&this->scriptContext->sourceList);
  __enterScriptObject.library = this_00;
  for (lVar26 = 0;
      lVar26 < (pLVar17->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).count; lVar26 = lVar26 + 1) {
    pRVar1 = (pLVar17->
             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
             ).buffer.ptr[lVar26].ptr;
    if ((((ulong)pRVar1 & 1) == 0 && pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
       (pUVar2 = (Utf8SourceInfo *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef,
       pUVar2 != (Utf8SourceInfo *)0x0)) {
      WalkAndAddUtf8SourceInfo(this,pUVar2,local_80);
    }
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)auStack_d8);
  puVar18 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  bVar11 = (byte)local_64 ^ 1;
  lVar26 = 0;
  do {
    local_38 = 0;
    if ((local_80->
        super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).count
        <= lVar26) {
LAB_007e06bd:
      HVar25 = -0x7fffbffb;
      if ((this->field_0x1c & 1) == 0) {
        iVar13 = (*(this->scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
        HVar25 = -0x7fffbffb;
        if ((char)iVar13 == '\0') {
          HVar25 = local_38;
        }
        if ((bVar11 == 0 && (char)iVar13 == '\0') &&
           (bVar12 = ScriptContext::HaveCalleeSources(this->scriptContext), HVar25 = local_38,
           bVar12 && this->hostDebugContext != (HostDebugContext *)0x0)) {
          pSVar8 = this->scriptContext;
          bVar12 = ScriptContext::HaveCalleeSources(pSVar8);
          if (bVar12) {
            pLVar23 = Memory::
                      RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
                      ::operator->(&pSVar8->calleeUtf8SourceInfoList);
            for (lVar26 = 0;
                lVar26 < (pLVar23->
                         super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                         ).count; lVar26 = lVar26 + 1) {
              pRVar1 = (pLVar23->
                       super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                       ).buffer.ptr[lVar26].ptr;
              if (((ulong)pRVar1 & 1) == 0 &&
                  pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) {
                this_03 = Memory::
                          RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
                          ::operator->(&pSVar8->calleeUtf8SourceInfoList);
                bVar12 = JsUtil::
                         List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
                         ::IsItemValid(this_03,(int)lVar26);
                if ((bVar12) && ((this->field_0x1c & 1) == 0)) {
                  pcVar9 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef;
                  iVar13 = (*(this->scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo
                             [0x24])();
                  if ((char)iVar13 == '\0') {
                    (*this->hostDebugContext->_vptr_HostDebugContext[4])
                              (this->hostDebugContext,pcVar9);
                  }
                }
              }
            }
          }
          if ((pSVar8->calleeUtf8SourceInfoList).ptr !=
              (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
               *)0x0) {
            Memory::
            RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
            ::Unroot(&pSVar8->calleeUtf8SourceInfoList,pSVar8->recycler);
          }
        }
      }
      ThreadContext::ReleaseTemporaryAllocator
                ((ThreadContext *)__enterScriptObject.library,tempAllocator);
      if (shouldReparseFunctions) {
        this->field_0x1c = this->field_0x1c & 0xfd;
      }
      return HVar25;
    }
    if ((this->field_0x1c & 1) != 0) {
LAB_007e06b6:
      local_38 = -0x7fffbffb;
      goto LAB_007e06bd;
    }
    pUVar2 = (local_80->
             super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
             buffer.ptr[lVar26].ptr;
    iVar13 = (*(this->scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
    if ((char)iVar13 != '\0') goto LAB_007e06b6;
    Output::Trace(DebuggerPhase,
                  L"DebugContext::RundownSourcesAndReparse scriptContext 0x%p, sourceInfo 0x%p, HasDebugDocument %d\n"
                  ,this->scriptContext,pUVar2,
                  (ulong)((pUVar2->m_debugDocument).ptr != (DebugDocument *)0x0));
    if ((pUVar2->field_0xa8 & 4) == 0) {
      pSVar3 = (pUVar2->m_srcInfo).ptr;
      if ((pSVar3 == (SRCINFO *)0x0) ||
         ((pSVar3->sourceContextInfo).ptr == (SourceContextInfo *)0x0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar18 = 1;
        bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                     ,0xfe,
                                     "(sourceInfo->GetSrcInfo() && sourceInfo->GetSrcInfo()->sourceContextInfo)"
                                     ,
                                     "sourceInfo->GetSrcInfo() && sourceInfo->GetSrcInfo()->sourceContextInfo"
                                    );
        if (!bVar12) goto LAB_007e080a;
        *puVar18 = 0;
      }
      local_70 = 0xffffffffffffffff;
      if ((char)local_64 != '\0') {
        if ((pUVar2->m_debugDocument).ptr != (DebugDocument *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar18 = 1;
          bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                       ,0x104,"(!sourceInfo->HasDebugDocument())",
                                       "!sourceInfo->HasDebugDocument()");
          if (!bVar12) {
LAB_007e080a:
            pcVar10 = (code *)invalidInstructionException();
            (*pcVar10)();
          }
          *puVar18 = 0;
        }
        pHVar4 = this->hostDebugContext;
        local_70 = 0xffffffffffffffff;
        if (pHVar4 != (HostDebugContext *)0x0) {
          iVar13 = (*pHVar4->_vptr_HostDebugContext[1])(pHVar4,pUVar2);
          local_70 = CONCAT44(extraout_var,iVar13);
        }
      }
      pLVar5 = (pUVar2->topLevelFunctionInfoList).ptr;
      if ((pLVar5 != (List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)0x0) &&
         ((pLVar5->super_ReadOnlyList<Js::FunctionInfo_*,_Memory::Recycler,_DefaultComparer>).count
          != 0)) {
        local_78 = pLVar5;
        if ((this->hostDebugContext != (HostDebugContext *)0x0) &&
           (pSVar19 = Utf8SourceInfo::GetSourceContextInfo(pUVar2),
           pSVar19 != (SourceContextInfo *)0x0)) {
          pHVar4 = this->hostDebugContext;
          pSVar19 = Utf8SourceInfo::GetSourceContextInfo(pUVar2);
          (*pHVar4->_vptr_HostDebugContext[2])(pHVar4,(pSVar19->field_5).field_0.url);
        }
        if (shouldReparseFunctions) {
          JsUtil::
          BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Clear(this_02);
          AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                    ((AutoNestedHandledExceptionType *)auStack_d8,ExceptionType_OutOfMemory);
          pSVar6 = (pUVar2->functionBodyDictionary).ptr;
          if (pSVar6 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                         *)0x0) {
            uVar24 = 0;
            while (uVar24 < (pSVar6->
                            super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                            ).bucketCount) {
              iVar13 = (pSVar6->
                       super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ).buckets.ptr[uVar24];
              ___autoNestedHandledExceptionType_2 = uVar24;
              if (iVar13 != -1) {
                while (iVar13 != -1) {
                  pSVar7 = (pSVar6->
                           super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           ).entries.ptr;
                  iVar15 = pSVar7[iVar13].
                           super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           .
                           super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                           .
                           super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                           .
                           super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                           .next;
                  pFVar22 = pSVar7[iVar13].
                            super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                            .
                            super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                            .
                            super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                            .
                            super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                            .value.ptr;
                  if (pFVar22 == (FunctionBody *)0x0) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    *puVar18 = 1;
                    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                                 ,0xa2,"(functionBody)","functionBody");
                    if (!bVar12) goto LAB_007e080a;
                    *puVar18 = 0;
                  }
                  bVar12 = FunctionProxy::IsCoroutine((FunctionProxy *)pFVar22);
                  iVar13 = iVar15;
                  if ((bVar12) &&
                     (RVar14 = FunctionBody::GetYieldRegister(pFVar22), RVar14 != 0xffffffff)) {
                    local_88 = ParseableFunctionInfo::StartInDocument
                                         (&pFVar22->super_ParseableFunctionInfo);
                    local_84 = FunctionBody::GetYieldRegister(pFVar22);
                    JsUtil::
                    BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    ::
                    Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                              ((BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                *)this_02,&local_88,&local_84);
                  }
                }
              }
              uVar24 = ___autoNestedHandledExceptionType_2 + 1;
            }
          }
          AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                    ((AutoNestedHandledExceptionType *)auStack_d8);
        }
        ___autoNestedHandledExceptionType_2 =
             ___autoNestedHandledExceptionType_2 & 0xffffffff00000000;
        for (iVar13 = 0;
            iVar13 < (local_78->
                     super_ReadOnlyList<Js::FunctionInfo_*,_Memory::Recycler,_DefaultComparer>).
                     count; iVar13 = iVar13 + 1) {
          if (((this->field_0x1c & 1) != 0) ||
             (iVar15 = (*(this->scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo
                         [0x24])(), (char)iVar15 != '\0')) goto LAB_007e06b6;
          pTVar20 = JsUtil::
                    List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item(local_78,iVar13);
          this_01 = pTVar20->ptr;
          if (this_01 != (FunctionInfo *)0x0) {
            if (shouldReparseFunctions) {
              AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                        (&local_68,
                         ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                         ExceptionType_OutOfMemory);
              pSVar8 = this->scriptContext;
              auStack_d8 = (undefined1  [8])0x0;
              ___autoNestedHandledExceptionType = (void *)0x0;
              EnterScriptObject::EnterScriptObject
                        ((EnterScriptObject *)local_108,pSVar8,(ScriptEntryExitRecord *)auStack_d8,
                         unaff_retaddr,&stack0x00000000,false,false,false);
              ScriptContext::OnScriptStart(pSVar8,false,true);
              EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_108);
              pPVar21 = FunctionInfo::GetParseableFunctionInfo(this_01);
              ParseableFunctionInfo::Parse(pPVar21,(ScriptFunction **)0x0,false);
              pFVar22 = FunctionInfo::GetFunctionBody(this_01);
              FunctionBody::EnsureDynamicProfileInfo(pFVar22);
              EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_108);
              AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_68);
            }
            pPVar21 = FunctionInfo::GetParseableFunctionInfo(this_01);
            if ((((byte)___autoNestedHandledExceptionType_2 | bVar11) & 1) == 0) {
              if (((this->field_0x1c & 1) == 0) &&
                 (iVar15 = (*(this->scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo
                             [0x24])(), (char)iVar15 == '\0')) {
                AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                          ((AutoNestedHandledExceptionType *)auStack_d8,ExceptionType_OutOfMemory);
                title = ParseableFunctionInfo::GetSourceName(pPVar21);
                RegisterFunction(this,pPVar21,local_70,title);
                AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                          ((AutoNestedHandledExceptionType *)auStack_d8);
                ___autoNestedHandledExceptionType_2 =
                     CONCAT44(uStack_5c,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
              }
              else {
                ___autoNestedHandledExceptionType_2 =
                     ___autoNestedHandledExceptionType_2 & 0xffffffff00000000;
              }
            }
          }
        }
        if ((shouldReparseFunctions) &&
           (pSVar6 = (pUVar2->functionBodyDictionary).ptr,
           pSVar6 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                      *)0x0)) {
          for (uVar24 = 0;
              uVar24 < (pSVar6->
                       super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ).bucketCount; uVar24 = uVar24 + 1) {
            iVar13 = (pSVar6->
                     super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ).buckets.ptr[uVar24];
            if (iVar13 != -1) {
              while (iVar13 != -1) {
                pSVar7 = (pSVar6->
                         super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ).entries.ptr;
                iVar15 = pSVar7[iVar13].
                         super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .
                         super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                         .
                         super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                         .
                         super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                         .next;
                pFVar22 = pSVar7[iVar13].
                          super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                          .
                          super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                          .
                          super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                          .
                          super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                          .value.ptr;
                if (pFVar22 == (FunctionBody *)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar18 = 1;
                  bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                               ,0xa2,"(functionBody)","functionBody");
                  if (!bVar12) goto LAB_007e080a;
                  *puVar18 = 0;
                }
                bVar12 = FunctionProxy::IsCoroutine((FunctionProxy *)pFVar22);
                if (bVar12) {
                  auStack_d8._0_4_ = 0xffffffff;
                  local_108._0_4_ =
                       ParseableFunctionInfo::StartInDocument(&pFVar22->super_ParseableFunctionInfo)
                  ;
                  bVar12 = JsUtil::
                           BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           ::TryGetValue<unsigned_int>(this_02,(uint *)local_108,(uint *)auStack_d8)
                  ;
                  if (bVar12) {
                    DVar16.handledExceptionType = FunctionBody::GetYieldRegister(pFVar22);
                    if (DVar16.handledExceptionType != auStack_d8._0_4_) {
                      AssertCount = AssertCount + 1;
                      Throw::LogAssert();
                      *puVar18 = 1;
                      bVar12 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                                  ,0x167,
                                                  "(pFuncBody->GetYieldRegister() == oldYieldRegister)"
                                                  ,
                                                  "pFuncBody->GetYieldRegister() == oldYieldRegister"
                                                  );
                      if (!bVar12) goto LAB_007e080a;
                      *puVar18 = 0;
                    }
                  }
                }
                bVar12 = ParseableFunctionInfo::IsFunctionParsed
                                   (&pFVar22->super_ParseableFunctionInfo);
                if (bVar12) {
                  FunctionBody::ReinitializeExecutionModeAndLimits(pFVar22);
                }
                FunctionBody::UpdateEntryPointsOnDebugReparse(pFVar22);
                iVar13 = iVar15;
              }
            }
          }
        }
      }
    }
    else if ((shouldReparseFunctions) &&
            (pSVar6 = (pUVar2->functionBodyDictionary).ptr,
            pSVar6 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                       *)0x0)) {
      for (uVar24 = 0;
          uVar24 < (pSVar6->
                   super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ).bucketCount; uVar24 = uVar24 + 1) {
        iVar13 = (pSVar6->
                 super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ).buckets.ptr[uVar24];
        if (iVar13 != -1) {
          while (iVar13 != -1) {
            pSVar7 = (pSVar6->
                     super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ).entries.ptr;
            iVar15 = pSVar7[iVar13].
                     super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>.
                     super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                     .
                     super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                     .next;
            pFVar22 = pSVar7[iVar13].
                      super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                      .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                      .
                      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                      .
                      super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                      .value.ptr;
            if (pFVar22 == (FunctionBody *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar18 = 1;
              bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                           ,0xa2,"(functionBody)","functionBody");
              if (!bVar12) goto LAB_007e080a;
              *puVar18 = 0;
            }
            bVar12 = ParseableFunctionInfo::IsFunctionParsed(&pFVar22->super_ParseableFunctionInfo);
            if (bVar12) {
              FunctionBody::ReinitializeExecutionModeAndLimits(pFVar22);
            }
            FunctionBody::UpdateEntryPointsOnDebugReparse(pFVar22);
            iVar13 = iVar15;
          }
        }
      }
    }
    lVar26 = lVar26 + 1;
  } while( true );
}

Assistant:

HRESULT DebugContext::RundownSourcesAndReparse(bool shouldPerformSourceRundown, bool shouldReparseFunctions)
    {
        struct AutoRestoreIsReparsingSource
        {
            AutoRestoreIsReparsingSource(DebugContext* debugContext, bool shouldReparseFunctions)
                : debugContext(debugContext)
                , shouldReparseFunctions(shouldReparseFunctions)
            {
                if (this->shouldReparseFunctions)
                {
                    this->debugContext->isReparsingSource = true;
                }
            }
            ~AutoRestoreIsReparsingSource()
            {
                if (this->shouldReparseFunctions)
                {
                    this->debugContext->isReparsingSource = false;
                }
            }

        private:
            DebugContext* debugContext;
            bool shouldReparseFunctions;
        } autoRestoreIsReparsingSource(this, shouldReparseFunctions);

        OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::RundownSourcesAndReparse scriptContext 0x%p, shouldPerformSourceRundown %d, shouldReparseFunctions %d\n"),
            this->scriptContext, shouldPerformSourceRundown, shouldReparseFunctions);

        Js::TempArenaAllocatorObject *tempAllocator = nullptr;
        JsUtil::List<Js::FunctionInfo *, Recycler>* pFunctionsToRegister = nullptr;
        JsUtil::List<Js::Utf8SourceInfo *, Recycler, false, Js::CopyRemovePolicy, RecyclerPointerComparer>* utf8SourceInfoList = nullptr;
        typedef JsUtil::BaseDictionary<uint32, RegSlot, ArenaAllocator, PowerOf2SizePolicy> FunctionStartToYieldRegister;

        // This container ensures that for Generator/Async functions the yield register is same between non-debug to debug parse.
        // Each entry represent a function's start position (each function will have unique start position in a file) and that function yield register
        FunctionStartToYieldRegister *yieldFunctions = nullptr;

        HRESULT hr = S_OK;
        ThreadContext* threadContext = this->scriptContext->GetThreadContext();

        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        tempAllocator = threadContext->GetTemporaryAllocator(_u("debuggerAlloc"));

        utf8SourceInfoList = JsUtil::List<Js::Utf8SourceInfo *, Recycler, false, Js::CopyRemovePolicy, RecyclerPointerComparer>::New(this->scriptContext->GetRecycler());
        yieldFunctions = Anew(tempAllocator->GetAllocator(), FunctionStartToYieldRegister, tempAllocator->GetAllocator());

        this->MapUTF8SourceInfoUntil([&](Js::Utf8SourceInfo * sourceInfo) -> bool
        {
            WalkAndAddUtf8SourceInfo(sourceInfo, utf8SourceInfoList);
            return false;
        });
        END_TRANSLATE_OOM_TO_HRESULT(hr);

        if (FAILED(hr))
        {
            Assert(hr == E_OUTOFMEMORY);
            return hr;
        }

        utf8SourceInfoList->MapUntil([&](int index, Js::Utf8SourceInfo * sourceInfo) -> bool
        {
            if (this->IsSelfOrScriptContextClosed())
            {
                hr = E_FAIL;
                return true;
            }

            OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::RundownSourcesAndReparse scriptContext 0x%p, sourceInfo 0x%p, HasDebugDocument %d\n"),
                this->scriptContext, sourceInfo, sourceInfo->HasDebugDocument());

            if (sourceInfo->GetIsLibraryCode())
            {
                // Not putting the internal library code to the debug mode, but need to reinitialize execution mode limits of each
                // function body upon debugger detach, even for library code at the moment.
                if (shouldReparseFunctions)
                {
                    sourceInfo->MapFunction([](Js::FunctionBody *const pFuncBody)
                    {
                        if (pFuncBody->IsFunctionParsed())
                        {
                            pFuncBody->ReinitializeExecutionModeAndLimits();
                        }
                        pFuncBody->UpdateEntryPointsOnDebugReparse();
                    });
                }

                return false;
            }

            Assert(sourceInfo->GetSrcInfo() && sourceInfo->GetSrcInfo()->sourceContextInfo);

#if DBG
            if (shouldPerformSourceRundown)
            {
                // We shouldn't have a debug document if we're running source rundown for the first time.
                Assert(!sourceInfo->HasDebugDocument());
            }
#endif // DBG

            DWORD_PTR dwDebugHostSourceContext = Js::Constants::NoHostSourceContext;

            if (shouldPerformSourceRundown && this->hostDebugContext != nullptr)
            {
                dwDebugHostSourceContext = this->hostDebugContext->GetHostSourceContext(sourceInfo);
            }

            pFunctionsToRegister = sourceInfo->GetTopLevelFunctionInfoList();

            if (pFunctionsToRegister == nullptr || pFunctionsToRegister->Count() == 0)
            {
                // This could happen if there are no functions to re-compile.
                return false;
            }

            if (this->hostDebugContext != nullptr && sourceInfo->GetSourceContextInfo())
            {
                // This call goes out of engine
                this->hostDebugContext->SetThreadDescription(sourceInfo->GetSourceContextInfo()->url); // the HRESULT is omitted.
            }

            if (shouldReparseFunctions)
            {
                yieldFunctions->Clear();
                BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
                {
                    sourceInfo->MapFunction([&](Js::FunctionBody *const pFuncBody)
                    {
                        if (pFuncBody->IsCoroutine() && pFuncBody->GetYieldRegister() != Js::Constants::NoRegister)
                        {
                            yieldFunctions->Add(pFuncBody->StartInDocument(), pFuncBody->GetYieldRegister());
                        }
                    });
                }
                END_TRANSLATE_OOM_TO_HRESULT(hr);
                DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);
            }

            bool fHasDoneSourceRundown = false;
            for (int i = 0; i < pFunctionsToRegister->Count(); i++)
            {
                if (this->IsSelfOrScriptContextClosed())
                {
                    hr = E_FAIL;
                    return true;
                }

                Js::FunctionInfo *functionInfo = pFunctionsToRegister->Item(i);
                if (functionInfo == nullptr)
                {
                    continue;
                }

                if (shouldReparseFunctions)
                {
                    BEGIN_JS_RUNTIME_CALL_EX_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED(this->scriptContext, false)
                    {
                        functionInfo->GetParseableFunctionInfo()->Parse();
                        // This is the first call to the function, ensure dynamic profile info
#if ENABLE_PROFILE_INFO
                        functionInfo->GetFunctionBody()->EnsureDynamicProfileInfo();
#endif
                    }
                    END_JS_RUNTIME_CALL_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT(hr);

                    // Debugger attach/detach failure is catastrophic, take down the process
                    DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);
                }

                // Parsing the function may change its FunctionProxy.
                Js::ParseableFunctionInfo *parseableFunctionInfo = functionInfo->GetParseableFunctionInfo();

                if (!fHasDoneSourceRundown && shouldPerformSourceRundown && !this->IsSelfOrScriptContextClosed())
                {
                    BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
                    {
                        this->RegisterFunction(parseableFunctionInfo, dwDebugHostSourceContext, parseableFunctionInfo->GetSourceName());
                    }
                    END_TRANSLATE_OOM_TO_HRESULT(hr);

                    DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);

                    fHasDoneSourceRundown = true;
                }